

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

bool __thiscall QWizardPage::isFinalPage(QWizardPage *this)

{
  int iVar1;
  QWizardPagePrivate *pQVar2;
  QWizard *this_00;
  QWizardPage *pQVar3;
  QWizardPage *in_RDI;
  QWizard *wizard;
  QWizardPagePrivate *d;
  QWizardPage *in_stack_ffffffffffffffe0;
  bool local_1;
  
  pQVar2 = d_func((QWizardPage *)0x7b593b);
  if ((pQVar2->explicitlyFinal & 1U) == 0) {
    this_00 = QWizardPage::wizard(in_stack_ffffffffffffffe0);
    if ((this_00 != (QWizard *)0x0) && (pQVar3 = QWizard::currentPage(this_00), pQVar3 == in_RDI)) {
      iVar1 = (**(code **)(*(long *)&(this_00->super_QDialog).super_QWidget + 0x1d0))();
      return iVar1 == -1;
    }
    iVar1 = (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1c0))();
    local_1 = iVar1 == -1;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QWizardPage::isFinalPage() const
{
    Q_D(const QWizardPage);
    if (d->explicitlyFinal)
        return true;

    QWizard *wizard = this->wizard();
    if (wizard && wizard->currentPage() == this) {
        // try to use the QWizard implementation if possible
        return wizard->nextId() == -1;
    } else {
        return nextId() == -1;
    }
}